

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O0

void UnityPrintNumberByStyle(UNITY_INT number,UNITY_DISPLAY_STYLE_T style)

{
  UNITY_DISPLAY_STYLE_T style_local;
  UNITY_INT number_local;
  
  if ((style & 0x10) == 0x10) {
    if (style == UNITY_DISPLAY_STYLE_CHAR) {
      putchar(0x27);
      if ((number < 0x7f) && (0x1f < number)) {
        putchar((int)number);
      }
      else if (number == 0xd) {
        putchar(0x5c);
        putchar(0x72);
      }
      else if (number == 10) {
        putchar(0x5c);
        putchar(0x6e);
      }
      else {
        putchar(0x5c);
        putchar(0x78);
        UnityPrintNumberHex(number,'\x02');
      }
      putchar(0x27);
    }
    else {
      UnityPrintNumber(number);
    }
  }
  else if ((style & 0x20) == 0x20) {
    UnityPrintNumberUnsigned(number);
  }
  else {
    putchar(0x30);
    putchar(0x78);
    UnityPrintNumberHex(number,(char)((style & 0xf) << 1));
  }
  return;
}

Assistant:

void UnityPrintNumberByStyle(const UNITY_INT number, const UNITY_DISPLAY_STYLE_T style)
{
    if ((style & UNITY_DISPLAY_RANGE_INT) == UNITY_DISPLAY_RANGE_INT)
    {
        if (style == UNITY_DISPLAY_STYLE_CHAR)
        {
            /* printable characters plus CR & LF are printed */
            UNITY_OUTPUT_CHAR('\'');
            if ((number <= 126) && (number >= 32))
            {
                UNITY_OUTPUT_CHAR((int)number);
            }
            /* write escaped carriage returns */
            else if (number == 13)
            {
                UNITY_OUTPUT_CHAR('\\');
                UNITY_OUTPUT_CHAR('r');
            }
            /* write escaped line feeds */
            else if (number == 10)
            {
                UNITY_OUTPUT_CHAR('\\');
                UNITY_OUTPUT_CHAR('n');
            }
            /* unprintable characters are shown as codes */
            else
            {
                UNITY_OUTPUT_CHAR('\\');
                UNITY_OUTPUT_CHAR('x');
                UnityPrintNumberHex((UNITY_UINT)number, 2);
            }
            UNITY_OUTPUT_CHAR('\'');
        }
        else
        {
            UnityPrintNumber(number);
        }
    }
    else if ((style & UNITY_DISPLAY_RANGE_UINT) == UNITY_DISPLAY_RANGE_UINT)
    {
        UnityPrintNumberUnsigned((UNITY_UINT)number);
    }
    else
    {
        UNITY_OUTPUT_CHAR('0');
        UNITY_OUTPUT_CHAR('x');
        UnityPrintNumberHex((UNITY_UINT)number, (char)((style & 0xF) * 2));
    }
}